

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::Struct::AddMemberDecoration
          (Struct *this,uint32_t index,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *decoration)

{
  size_type sVar1;
  mapped_type *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *decoration_local;
  Struct *pSStack_10;
  uint32_t index_local;
  Struct *this_local;
  
  decoration_local._4_4_ = index;
  pSStack_10 = this;
  sVar1 = std::
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          ::size(&this->element_types_);
  if (sVar1 <= index) {
    __assert_fail("0 && \"index out of bound\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/types.cpp"
                  ,499,
                  "void spvtools::opt::analysis::Struct::AddMemberDecoration(uint32_t, std::vector<uint32_t> &&)"
                 );
  }
  this_00 = std::
            map<unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
            ::operator[](&this->element_decorations_,
                         (key_type_conflict *)((long)&decoration_local + 4));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back(this_00,decoration);
  return;
}

Assistant:

void Struct::AddMemberDecoration(uint32_t index,
                                 std::vector<uint32_t>&& decoration) {
  if (index >= element_types_.size()) {
    assert(0 && "index out of bound");
    return;
  }

  element_decorations_[index].push_back(std::move(decoration));
}